

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.cpp
# Opt level: O1

void run_test(string *expression,string *expected_value)

{
  char cVar1;
  ostream *poVar2;
  shared_ptr<SchemeObject> sVar3;
  shared_ptr<SchemeObject> actual_result;
  shared_ptr<SchemeObject> expected_result;
  istringstream in2;
  istringstream in1;
  undefined1 local_378 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_358 [2];
  char *local_338;
  long local_330;
  istringstream local_318 [120];
  ios_base local_2a0 [264];
  istringstream local_198 [120];
  ios_base local_120 [264];
  
  run_test::test_num = run_test::test_num + 1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Test ",5);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,run_test::test_num);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,": ",2);
  init_scheme();
  std::__cxx11::istringstream::istringstream(local_198);
  std::__cxx11::istringstream::istringstream(local_318);
  evaluate_string_in_global_context((string *)(local_378 + 0x10));
  sVar3 = evaluate_string_in_global_context((string *)local_378);
  if (local_378._16_8_ != local_378._0_8_) {
    cVar1 = (**(code **)(*(long *)local_378._16_8_ + 0x30))
                      (local_378._16_8_,local_378,
                       sVar3.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi._M_pi);
    if (cVar1 == '\0') {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FAILED\n",7);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(expression->_M_dataplus)._M_p,
                          expression->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(expected_value->_M_dataplus)._M_p,expected_value->_M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," [[ ",4);
      (**(code **)(*(long *)local_378._0_8_ + 0x10))(&local_338);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,local_338,local_330);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," != ",4);
      (**(code **)(*(long *)local_378._16_8_ + 0x10))(local_358,local_378._16_8_);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,(char *)local_358[0]._0_8_,local_358[0]._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," ]]",3);
      std::endl<char,std::char_traits<char>>(poVar2);
      std::__cxx11::string::~string((string *)local_358[0]._M_local_buf);
      std::__cxx11::string::~string((string *)&local_338);
      exit(1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"OK",2);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_378._24_8_);
  }
  std::__cxx11::istringstream::~istringstream(local_318);
  std::ios_base::~ios_base(local_2a0);
  std::__cxx11::istringstream::~istringstream(local_198);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

static void run_test(const std::string &expression, const std::string &expected_value)
{
    static int test_num = 0;
    ++test_num;
    std::cout << "Test " << test_num << ": ";
    init_scheme();
    std::istringstream in1, in2;
    auto expected_result = evaluate_string_in_global_context(expected_value);
    auto actual_result = evaluate_string_in_global_context(expression);
    if(expected_result != actual_result && !expected_result->is_eq(actual_result))
    {
        std::cout << "FAILED\n" << expression << " != " << expected_value << " [[ " << actual_result->external_repr()
                  << " != " << expected_result->external_repr() << " ]]" << std::endl;
        exit(1);
    }
    std::cout << "OK" << std::endl;
}